

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::synchronization_internal::anon_unknown_0::
Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>::Grow
          (Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*> *this,
          uint32_t n)

{
  uint uVar1;
  Node **__dest;
  
  uVar1 = this->capacity_;
  if (uVar1 < n) {
    do {
      uVar1 = uVar1 * 2;
    } while (uVar1 < n);
    this->capacity_ = uVar1;
  }
  __dest = (Node **)base_internal::LowLevelAlloc::AllocWithArena
                              ((ulong)uVar1 << 3,(anonymous_namespace)::arena);
  if ((ulong)this->size_ != 0) {
    memmove(__dest,this->ptr_,(ulong)this->size_ << 3);
  }
  if (this->ptr_ != this->space_) {
    base_internal::LowLevelAlloc::Free(this->ptr_);
  }
  this->ptr_ = __dest;
  return;
}

Assistant:

void Grow(uint32_t n) {
    while (capacity_ < n) {
      capacity_ *= 2;
    }
    size_t request = static_cast<size_t>(capacity_) * sizeof(T);
    T* copy = static_cast<T*>(
        base_internal::LowLevelAlloc::AllocWithArena(request, arena));
    std::copy_n(ptr_, size_, copy);
    Discard();
    ptr_ = copy;
  }